

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uchar *local_38;
  
  puVar1 = ctx->buf + ctx->rk_offset + 4;
  uVar4 = ((mbedtls_aes_context *)(puVar1 + -4))->nr ^ *(uint *)input;
  uVar6 = puVar1[-3] ^ *(uint *)(input + 4);
  uVar7 = (uint)*(size_t *)(puVar1 + -2) ^ *(uint *)(input + 8);
  uVar3 = puVar1[-1] ^ *(uint *)(input + 0xc);
  iVar5 = ctx->nr >> 1;
  if (1 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      uVar8 = FT0[uVar4 & 0xff] ^ *puVar1 ^ FT1[uVar6 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar3 >> 0x18];
      uVar9 = FT0[uVar6 & 0xff] ^ puVar1[1] ^ FT1[uVar7 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar3 >> 0xe & 0x3fc)) ^ FT3[uVar4 >> 0x18];
      uVar2 = FT0[uVar7 & 0xff] ^ puVar1[2] ^ FT1[uVar3 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ FT3[uVar6 >> 0x18];
      uVar3 = FT0[uVar3 & 0xff] ^ puVar1[3] ^ FT1[uVar4 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
      uVar4 = FT0[uVar8 & 0xff] ^ puVar1[4] ^ FT1[uVar9 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar2 >> 0xe & 0x3fc)) ^ FT3[uVar3 >> 0x18];
      uVar6 = FT0[uVar9 & 0xff] ^ puVar1[5] ^ FT1[uVar2 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar3 >> 0xe & 0x3fc)) ^ FT3[uVar8 >> 0x18];
      uVar7 = FT0[uVar2 & 0xff] ^ puVar1[6] ^ FT1[uVar3 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
      uVar3 = FT0[uVar3 & 0xff] ^ puVar1[7] ^ FT1[uVar8 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar2 >> 0x18];
      puVar1 = puVar1 + 8;
      iVar5 = iVar5 + -1;
    } while (2 < iVar5);
  }
  local_48 = FT0[uVar4 & 0xff] ^ *puVar1 ^ FT1[uVar6 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar3 >> 0x18];
  local_44 = FT0[uVar6 & 0xff] ^ puVar1[1] ^ FT1[uVar7 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar3 >> 0xe & 0x3fc)) ^ FT3[uVar4 >> 0x18];
  local_40 = FT0[uVar7 & 0xff] ^ puVar1[2] ^ FT1[uVar3 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ FT3[uVar6 >> 0x18];
  local_3c = FT0[uVar3 & 0xff] ^ puVar1[3] ^ FT1[uVar4 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
  local_58 = (uint)FSb[local_3c >> 0x18] << 0x18 ^
             (uint)FSb[local_40 >> 0x10 & 0xff] << 0x10 ^
             (uint)FSb[local_44 >> 8 & 0xff] << 8 ^ (uint)FSb[local_48 & 0xff] ^ puVar1[4];
  uStack_54 = (uint)FSb[local_48 >> 0x18] << 0x18 ^ (uint)FSb[local_3c >> 0x10 & 0xff] << 0x10 ^
              (uint)FSb[local_40 >> 8 & 0xff] << 8 ^ (uint)FSb[local_44 & 0xff] ^ puVar1[5];
  uStack_50 = (uint)FSb[local_44 >> 0x18] << 0x18 ^
              (uint)FSb[local_48 >> 0x10 & 0xff] << 0x10 ^ (uint)FSb[local_40 & 0xff] ^ puVar1[6] ^
              (uint)FSb[local_3c >> 8 & 0xff] << 8;
  uStack_4c = (uint)FSb[local_40 >> 0x18] << 0x18 ^ (uint)FSb[local_44 >> 0x10 & 0xff] << 0x10 ^
              (uint)FSb[local_48 >> 8 & 0xff] << 8 ^ (uint)FSb[local_3c & 0xff] ^ puVar1[7];
  *(uint *)output = local_58;
  *(uint *)(output + 4) = uStack_54;
  *(uint *)(output + 8) = uStack_50;
  *(uint *)(output + 0xc) = uStack_4c;
  local_38 = output;
  mbedtls_platform_zeroize(&local_58,0x20);
  return 0;
}

Assistant:

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,
                                 const unsigned char input[16],
                                 unsigned char output[16])
{
    int i;
    uint32_t *RK = ctx->buf + ctx->rk_offset;
    struct {
        uint32_t X[4];
        uint32_t Y[4];
    } t;

    t.X[0] = MBEDTLS_GET_UINT32_LE(input,  0); t.X[0] ^= *RK++;
    t.X[1] = MBEDTLS_GET_UINT32_LE(input,  4); t.X[1] ^= *RK++;
    t.X[2] = MBEDTLS_GET_UINT32_LE(input,  8); t.X[2] ^= *RK++;
    t.X[3] = MBEDTLS_GET_UINT32_LE(input, 12); t.X[3] ^= *RK++;

    for (i = (ctx->nr >> 1) - 1; i > 0; i--) {
        AES_FROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);
        AES_FROUND(t.X[0], t.X[1], t.X[2], t.X[3], t.Y[0], t.Y[1], t.Y[2], t.Y[3]);
    }

    AES_FROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);

    t.X[0] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[0])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[1])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[2])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[3])] << 24);

    t.X[1] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[1])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[2])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[3])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[0])] << 24);

    t.X[2] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[2])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[3])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[0])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[1])] << 24);

    t.X[3] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[3])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[0])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[1])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[2])] << 24);

    MBEDTLS_PUT_UINT32_LE(t.X[0], output,  0);
    MBEDTLS_PUT_UINT32_LE(t.X[1], output,  4);
    MBEDTLS_PUT_UINT32_LE(t.X[2], output,  8);
    MBEDTLS_PUT_UINT32_LE(t.X[3], output, 12);

    mbedtls_platform_zeroize(&t, sizeof(t));

    return 0;
}